

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvectr32.cpp
# Opt level: O2

void __thiscall
icu_63::UVector32::insertElementAt(UVector32 *this,int32_t elem,int32_t index,UErrorCode *status)

{
  int32_t *piVar1;
  UBool UVar2;
  long lVar3;
  
  if (((-1 < index) && (index <= this->count)) &&
     (UVar2 = ensureCapacity(this,this->count + 1,status), UVar2 != '\0')) {
    piVar1 = this->elements;
    for (lVar3 = (long)this->count; (long)(ulong)(uint)index < lVar3; lVar3 = lVar3 + -1) {
      piVar1[lVar3] = piVar1[lVar3 + -1];
    }
    piVar1[(uint)index] = elem;
    this->count = this->count + 1;
  }
  return;
}

Assistant:

void UVector32::insertElementAt(int32_t elem, int32_t index, UErrorCode &status) {
    // must have 0 <= index <= count
    if (0 <= index && index <= count && ensureCapacity(count + 1, status)) {
        for (int32_t i=count; i>index; --i) {
            elements[i] = elements[i-1];
        }
        elements[index] = elem;
        ++count;
    }
    /* else index out of range */
}